

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

state * getstate(lemon *lemp)

{
  int iVar1;
  plink *ppVar2;
  plink *ppVar3;
  config *pcVar4;
  state *data;
  config *pcVar5;
  state *extraout_RAX;
  plink *ppVar6;
  config *old;
  config *old_1;
  
  pcVar4 = (config *)msort(current,&current->bp,Configcmp);
  basisend = (config **)0x0;
  basis = (config *)0x0;
  data = State_find(pcVar4);
  if (data == (state *)0x0) {
    Configlist_closure(lemp);
    pcVar5 = (config *)msort(current,&current->next,Configcmp);
    currentend = (config **)0x0;
    current = (config *)0x0;
    data = State_new();
    if (data == (state *)0x0) {
      getstate_cold_1();
      basis = (config *)msort(current,&current->bp,Configcmp);
      basisend = (config **)0x0;
      return extraout_RAX;
    }
    data->bp = pcVar4;
    data->cfp = pcVar5;
    iVar1 = lemp->nstate;
    lemp->nstate = iVar1 + 1;
    data->statenum = iVar1;
    data->ap = (action *)0x0;
    State_insert(data,pcVar4);
    buildshifts(lemp,data);
  }
  else {
    pcVar5 = data->bp;
    ppVar6 = plink_freelist;
    if (pcVar5 != (config *)0x0 && pcVar4 != (config *)0x0) {
      do {
        ppVar3 = pcVar4->bplp;
        while (ppVar3 != (plink *)0x0) {
          ppVar2 = ppVar3->next;
          ppVar3->next = pcVar5->bplp;
          pcVar5->bplp = ppVar3;
          ppVar3 = ppVar2;
        }
        ppVar3 = pcVar4->fplp;
        while (ppVar2 = ppVar3, ppVar2 != (plink *)0x0) {
          ppVar3 = ppVar2->next;
          ppVar2->next = ppVar6;
          ppVar6 = ppVar2;
          plink_freelist = ppVar2;
        }
        pcVar4->fplp = (plink *)0x0;
        pcVar4->bplp = (plink *)0x0;
        pcVar4 = pcVar4->bp;
      } while ((pcVar4 != (config *)0x0) && (pcVar5 = pcVar5->bp, pcVar5 != (config *)0x0));
    }
    pcVar4 = current;
    current = (config *)0x0;
    currentend = (config **)0x0;
    Configlist_eat(pcVar4);
  }
  return data;
}

Assistant:

state *getstate(struct lemon *lemp)
{
  struct config *cfp, *bp;
  struct state *stp;

  /* Extract the sorted basis of the new state.  The basis was constructed
  ** by prior calls to "Configlist_addbasis()". */
  Configlist_sortbasis();
  bp = Configlist_basis();

  /* Get a state with the same basis */
  stp = State_find(bp);
  if( stp ){
    /* A state with the same basis already exists!  Copy all the follow-set
    ** propagation links from the state under construction into the
    ** preexisting state, then return a pointer to the preexisting state */
    struct config *x, *y;
    for(x=bp, y=stp->bp; x && y; x=x->bp, y=y->bp){
      Plink_copy(&y->bplp,x->bplp);
      Plink_delete(x->fplp);
      x->fplp = x->bplp = 0;
    }
    cfp = Configlist_return();
    Configlist_eat(cfp);
  }else{
    /* This really is a new state.  Construct all the details */
    Configlist_closure(lemp);    /* Compute the configuration closure */
    Configlist_sort();           /* Sort the configuration closure */
    cfp = Configlist_return();   /* Get a pointer to the config list */
    stp = State_new();           /* A new state structure */
    MemoryCheck(stp);
    stp->bp = bp;                /* Remember the configuration basis */
    stp->cfp = cfp;              /* Remember the configuration closure */
    stp->statenum = lemp->nstate++; /* Every state gets a sequence number */
    stp->ap = 0;                 /* No actions, yet. */
    State_insert(stp,stp->bp);   /* Add to the state table */
    buildshifts(lemp,stp);       /* Recursively compute successor states */
  }
  return stp;
}